

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parse.cpp
# Opt level: O0

HTTP_CODE csguide_webserver::HttpRequestParser::ParseRequestline
                    (char *line,PARSE_STATE *parse_state,HttpRequest *request)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  char *in_RDI;
  char *version;
  char *method;
  char *url;
  allocator local_59;
  string local_58 [32];
  char *local_38;
  char *local_30;
  char *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  char *local_10;
  HTTP_CODE local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pcVar2 = strpbrk(in_RDI," \t");
  if (pcVar2 == (char *)0x0) {
    local_4 = BAD_REQUEST;
  }
  else {
    local_28 = pcVar2 + 1;
    *pcVar2 = '\0';
    local_30 = local_10;
    iVar1 = strcasecmp(local_10,"GET");
    if (iVar1 == 0) {
      *local_20 = 0;
    }
    else {
      iVar1 = strcasecmp(local_30,"POST");
      if (iVar1 == 0) {
        *local_20 = 1;
      }
      else {
        iVar1 = strcasecmp(local_30,"PUT");
        if (iVar1 != 0) {
          return BAD_REQUEST;
        }
        *local_20 = 2;
      }
    }
    sVar3 = strspn(local_28," \t");
    local_28 = local_28 + sVar3;
    pcVar2 = strpbrk(local_28," \t");
    if (pcVar2 == (char *)0x0) {
      local_4 = BAD_REQUEST;
    }
    else {
      local_38 = pcVar2 + 1;
      *pcVar2 = '\0';
      sVar3 = strspn(local_38," \t");
      local_38 = local_38 + sVar3;
      iVar1 = strncasecmp("HTTP/1.1",local_38,8);
      if (iVar1 == 0) {
        local_20[1] = 1;
      }
      else {
        iVar1 = strncasecmp("HTTP/1.0",local_38,8);
        if (iVar1 != 0) {
          return BAD_REQUEST;
        }
        local_20[1] = 0;
      }
      iVar1 = strncasecmp(local_28,"http://",7);
      if (iVar1 == 0) {
        local_28 = local_28 + 7;
        local_28 = strchr(local_28,0x2f);
      }
      else {
        iVar1 = strncasecmp(local_28,"/",1);
        if (iVar1 != 0) {
          return BAD_REQUEST;
        }
      }
      pcVar2 = local_28;
      if ((local_28 == (char *)0x0) || (*local_28 != '/')) {
        local_4 = BAD_REQUEST;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_58,pcVar2,&local_59);
        std::__cxx11::string::operator=((string *)(local_20 + 2),local_58);
        std::__cxx11::string::~string(local_58);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
        *local_18 = 1;
        local_4 = NO_REQUEST;
      }
    }
  }
  return local_4;
}

Assistant:

HttpRequestParser::HTTP_CODE HttpRequestParser::ParseRequestline(char *line, PARSE_STATE &parse_state,
                                                                 HttpRequest &request) {
  char *url = strpbrk(line, " \t");
  if (!url) {
    return BAD_REQUEST;
  }

  // 分割 method 和 url
  *url++ = '\0';

  char *method = line;

  if (strcasecmp(method, "GET") == 0) {
    request.mMethod = HttpRequest::GET;
  } else if (strcasecmp(method, "POST") == 0) {
    request.mMethod = HttpRequest::POST;
  } else if (strcasecmp(method, "PUT") == 0) {
    request.mMethod = HttpRequest::PUT;
  } else {
    return BAD_REQUEST;
  }

  url += strspn(url, " \t");
  char *version = strpbrk(url, " \t");
  if (!version) {
    return BAD_REQUEST;
  }
  *version++ = '\0';
  version += strspn(version, " \t");

  // HTTP/1.1 后面可能还存在空白字符
  if (strncasecmp("HTTP/1.1", version, 8) == 0) {
    request.mVersion = HttpRequest::HTTP_11;
  } else if (strncasecmp("HTTP/1.0", version, 8) == 0) {
    request.mVersion = HttpRequest::HTTP_10;
  } else {
    return BAD_REQUEST;
  }

  if (strncasecmp(url, "http://", 7) == 0) {
    url += 7;
    url = strchr(url, '/');
  } else if (strncasecmp(url, "/", 1) == 0) {
    PASS;
  } else {
    return BAD_REQUEST;
  }

  if (!url || *url != '/') {
    return BAD_REQUEST;
  }
  request.mUri = std::string(url);
  // 分析头部字段
  parse_state = PARSE_HEADER;
  return NO_REQUEST;
}